

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneloader.h
# Opt level: O3

void json_parse_light<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
               (Scene *s,
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *c)

{
  pointer *pppPVar1;
  iterator iVar2;
  bool bVar3;
  const_reference pvVar4;
  PointLight *pPVar5;
  PointLight *local_38;
  undefined1 local_30 [24];
  
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)c,"type");
  bVar3 = nlohmann::operator==<const_char_*,_0>(pvVar4,"PointLight");
  if (bVar3) {
    pPVar5 = (PointLight *)operator_new(0x18);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>
              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)c,"o");
    json_to_v3<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)(local_30 + 0xc));
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>
              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                *)c,"c");
    json_to_v3<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_30);
    Vector3f::Vector3f((Vector3f *)pPVar5,(Vector3f *)(local_30 + 0xc));
    Vector3f::Vector3f(&pPVar5->c,(Vector3f *)local_30);
    iVar2._M_current =
         (s->point_lights).super__Vector_base<PointLight_*,_std::allocator<PointLight_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (s->point_lights).super__Vector_base<PointLight_*,_std::allocator<PointLight_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_38 = pPVar5;
      std::vector<PointLight*,std::allocator<PointLight*>>::_M_realloc_insert<PointLight*>
                ((vector<PointLight*,std::allocator<PointLight*>> *)&s->point_lights,iVar2,&local_38
                );
    }
    else {
      *iVar2._M_current = pPVar5;
      pppPVar1 = &(s->point_lights).super__Vector_base<PointLight_*,_std::allocator<PointLight_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppPVar1 = *pppPVar1 + 1;
    }
  }
  else {
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)c,"type");
    bVar3 = nlohmann::operator==<const_char_*,_0>(pvVar4,"PointLightDecay");
    if (bVar3) {
      pPVar5 = (PointLight *)operator_new(0x18);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>
                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  *)c,"o");
      json_to_v3<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)(local_30 + 0xc));
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>
                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  *)c,"c");
      json_to_v3<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_30);
      Vector3f::Vector3f((Vector3f *)pPVar5,(Vector3f *)(local_30 + 0xc));
      Vector3f::Vector3f(&pPVar5->c,(Vector3f *)local_30);
      iVar2._M_current =
           (s->point_lights_decay).super__Vector_base<PointLight_*,_std::allocator<PointLight_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (s->point_lights_decay).super__Vector_base<PointLight_*,_std::allocator<PointLight_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_38 = pPVar5;
        std::vector<PointLight*,std::allocator<PointLight*>>::_M_realloc_insert<PointLight*>
                  ((vector<PointLight*,std::allocator<PointLight*>> *)&s->point_lights_decay,iVar2,
                   &local_38);
      }
      else {
        *iVar2._M_current = pPVar5;
        pppPVar1 = &(s->point_lights_decay).
                    super__Vector_base<PointLight_*,_std::allocator<PointLight_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppPVar1 = *pppPVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

void json_parse_light(Scene& s,const T& c)
{
	if(c["type"]=="PointLight")
		s.point_lights.push_back(new PointLight(json_to_v3(c["o"]), json_to_v3(c["c"])));
	else if(c["type"]=="PointLightDecay")
		s.point_lights_decay.push_back(new PointLight(json_to_v3(c["o"]), json_to_v3(c["c"])));
}